

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void setnodevector(lua_State *L,Table *t,uint size)

{
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  byte bVar4;
  Node *n;
  int local_20;
  int lsize;
  int i;
  uint size_local;
  Table *t_local;
  lua_State *L_local;
  
  if (size == 0) {
    t->node = &dummynode_;
    t->lsizenode = '\0';
    t->lastfree = (Node *)0x0;
  }
  else {
    iVar1 = luaO_ceillog2(size);
    if ((0x1e < iVar1) || (bVar4 = (byte)iVar1, 0x40000000 < (uint)(1 << (bVar4 & 0x1f)))) {
      luaG_runerror(L,"table overflow");
    }
    uVar2 = 1 << (bVar4 & 0x1f);
    pNVar3 = (Node *)luaM_malloc_(L,(ulong)uVar2 * 0x18,0);
    t->node = pNVar3;
    for (local_20 = 0; local_20 < (int)uVar2; local_20 = local_20 + 1) {
      pNVar3 = t->node;
      (&pNVar3->u)[local_20].next = 0;
      (&pNVar3->u)[local_20].key_tt = '\0';
      (&pNVar3->u)[local_20].tt_ = '\x10';
    }
    t->lsizenode = bVar4;
    t->lastfree = t->node + uVar2;
  }
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, unsigned int size) {
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common 'dummynode' */
    t->lsizenode = 0;
    t->lastfree = NULL;  /* signal that it is using dummy node */
  }
  else {
    int i;
    int lsize = luaO_ceillog2(size);
    if (lsize > MAXHBITS || (1u << lsize) > MAXHSIZE)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i = 0; i < cast_int(size); i++) {
      Node *n = gnode(t, i);
      gnext(n) = 0;
      setnilkey(n);
      setempty(gval(n));
    }
    t->lsizenode = cast_byte(lsize);
    t->lastfree = gnode(t, size);  /* all positions are free */
  }
}